

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>&,char_const(&)[7],pstore::command_line::desc_const&,pstore::command_line::details::values_const&,pstore::command_line::details::initializer<endian>const&>
               (opt<endian,_pstore::command_line::parser<endian,_void>_> *opt,char (*m0) [7],
               desc *mods,values *mods_1,initializer<endian> *mods_2)

{
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,*m0,&local_69);
  name::name((name *)&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  option::set_name(&opt->super_option,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  option::set_description(&opt->super_option,&mods->desc_);
  details::values::
  apply<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>>(mods_1,opt);
  opt->value_ = *mods_2->init_;
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }